

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpe_model_trainer.h
# Opt level: O0

uint64_t sentencepiece::bpe::Trainer::EncodePos(int sid,int l,int r)

{
  int iVar1;
  unsigned_short uVar2;
  char *pcVar3;
  ostream *poVar4;
  uint64_t n;
  byte local_28;
  Die local_27;
  byte local_26;
  Die local_25 [15];
  byte local_16;
  Die local_15;
  int local_14;
  int local_10;
  int r_local;
  int l_local;
  int sid_local;
  
  local_16 = 0;
  local_14 = r;
  local_10 = l;
  r_local = sid;
  if (l < 0) {
    error::Die::Die(&local_15,true);
    local_16 = 1;
    pcVar3 = logging::BaseName("src/bpe_model_trainer.h");
    poVar4 = std::operator<<((ostream *)&std::cerr,pcVar3);
    poVar4 = std::operator<<(poVar4,"(");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x46);
    poVar4 = std::operator<<(poVar4,") [");
    poVar4 = std::operator<<(poVar4,"(l) >= (0)");
    poVar4 = std::operator<<(poVar4,"] ");
    error::Die::operator&(&local_15,poVar4);
  }
  if ((local_16 & 1) != 0) {
    error::Die::~Die(&local_15);
  }
  local_26 = 0;
  if (local_14 < 0) {
    error::Die::Die(local_25,true);
    local_26 = 1;
    pcVar3 = logging::BaseName("src/bpe_model_trainer.h");
    poVar4 = std::operator<<((ostream *)&std::cerr,pcVar3);
    poVar4 = std::operator<<(poVar4,"(");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x47);
    poVar4 = std::operator<<(poVar4,") [");
    poVar4 = std::operator<<(poVar4,"(r) >= (0)");
    poVar4 = std::operator<<(poVar4,"] ");
    error::Die::operator&(local_25,poVar4);
  }
  if ((local_26 & 1) != 0) {
    error::Die::~Die(local_25);
  }
  iVar1 = local_10;
  uVar2 = std::numeric_limits<unsigned_short>::max();
  local_28 = 0;
  if ((int)(uint)uVar2 < iVar1) {
    error::Die::Die(&local_27,true);
    local_28 = 1;
    pcVar3 = logging::BaseName("src/bpe_model_trainer.h");
    poVar4 = std::operator<<((ostream *)&std::cerr,pcVar3);
    poVar4 = std::operator<<(poVar4,"(");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x48);
    poVar4 = std::operator<<(poVar4,") [");
    poVar4 = std::operator<<(poVar4,"(l) <= (std::numeric_limits<uint16_t>::max())");
    poVar4 = std::operator<<(poVar4,"] ");
    error::Die::operator&(&local_27,poVar4);
  }
  if ((local_28 & 1) != 0) {
    error::Die::~Die(&local_27);
  }
  iVar1 = local_14;
  uVar2 = std::numeric_limits<unsigned_short>::max();
  n._6_1_ = 0;
  if ((int)(uint)uVar2 < iVar1) {
    error::Die::Die((Die *)((long)&n + 7),true);
    n._6_1_ = 1;
    pcVar3 = logging::BaseName("src/bpe_model_trainer.h");
    poVar4 = std::operator<<((ostream *)&std::cerr,pcVar3);
    poVar4 = std::operator<<(poVar4,"(");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x49);
    poVar4 = std::operator<<(poVar4,") [");
    poVar4 = std::operator<<(poVar4,"(r) <= (std::numeric_limits<uint16_t>::max())");
    poVar4 = std::operator<<(poVar4,"] ");
    error::Die::operator&((Die *)((long)&n + 7),poVar4);
  }
  if ((n._6_1_ & 1) != 0) {
    error::Die::~Die((Die *)((long)&n + 7));
  }
  return (long)r_local << 0x20 | (long)local_10 << 0x10 | (long)local_14;
}

Assistant:

static uint64_t EncodePos(int sid, int l, int r) {
    CHECK_GE(l, 0);
    CHECK_GE(r, 0);
    CHECK_LE(l, std::numeric_limits<uint16_t>::max());
    CHECK_LE(r, std::numeric_limits<uint16_t>::max());
    const uint64_t n = (static_cast<uint64_t>(sid) << 32) |
                       (static_cast<uint64_t>(l) << 16) | r;
    return n;
  }